

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_head.c
# Opt level: O0

ufile_error ufile_head(char *bucket_name,char *key,ufile_file_info *info)

{
  uint uVar1;
  ufile_error uVar2;
  undefined1 local_60 [8];
  http_options opt;
  CURL *curl;
  ufile_file_info *info_local;
  char *key_local;
  char *bucket_name_local;
  ufile_error error;
  
  uVar2 = check_bucket_key(bucket_name,key);
  error._0_8_ = uVar2.message;
  uVar1 = uVar2.code;
  bucket_name_local = (char *)(ulong)uVar1;
  if ((uVar1 == 0) || ((int)uVar1 / 100 == 2)) {
    opt.header = (curl_slist *)curl_easy_init();
    if (opt.header == (curl_slist *)0x0) {
      bucket_name_local = (char *)0xffffffec;
      error._0_8_ = anon_var_dwarf_5e6;
    }
    else {
      uVar2 = set_http_options((http_options *)local_60,"HEAD","",bucket_name,key,(char *)0x0);
      error._0_8_ = uVar2.message;
      uVar1 = uVar2.code;
      bucket_name_local = (char *)(ulong)uVar1;
      if ((uVar1 == 0) || ((int)uVar1 / 100 == 2)) {
        set_curl_options(opt.header,(http_options *)local_60);
        curl_easy_setopt(opt.header,0x4e6f,head_header_cb);
        curl_easy_setopt(opt.header,0x272d,info);
        curl_easy_setopt(opt.header,0x2c,1);
        uVar2 = curl_do(opt.header);
        error._0_8_ = uVar2.message;
        bucket_name_local = (char *)(ulong)(uint)uVar2.code;
        http_cleanup(opt.header,(http_options *)local_60);
      }
      else {
        http_cleanup(opt.header,(http_options *)local_60);
      }
    }
  }
  uVar2.message = (char *)error._0_8_;
  uVar2._0_8_ = bucket_name_local;
  return uVar2;
}

Assistant:

struct ufile_error
ufile_head(const char* bucket_name, const char *key, struct ufile_file_info *info){
    struct ufile_error error = NO_ERROR;
    error = check_bucket_key(bucket_name, key);
    if(UFILE_HAS_ERROR(error.code)){
        return error;
    }

    CURL *curl = curl_easy_init();
    if(curl == NULL){
        error.code = CURL_ERROR_CODE;
        error.message = CURL_INIT_ERROR_MSG;
        return error;
    }

    struct http_options opt;
    error = set_http_options(&opt, "HEAD", "", bucket_name, key, NULL);
    if(UFILE_HAS_ERROR(error.code)){
        http_cleanup(curl, &opt);
        return error;
    }

    set_curl_options(curl, &opt);
    curl_easy_setopt(curl, CURLOPT_HEADERFUNCTION, head_header_cb);
    curl_easy_setopt(curl, CURLOPT_HEADERDATA, (void *)info);
    curl_easy_setopt(curl, CURLOPT_NOBODY, 1);

    error = curl_do(curl);
    http_cleanup(curl, &opt);
    return error;
}